

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

int __thiscall CaDiCaL::Solver::vars(Solver *this)

{
  FILE *pFVar1;
  int iVar2;
  Option *pOVar3;
  undefined8 in_RCX;
  EVP_PKEY_CTX *file_name;
  char *pcVar4;
  char *pcVar5;
  Solver *pSVar6;
  Solver *this_00;
  bool bVar7;
  
  bVar7 = this->internal == (Internal *)0x0;
  pFVar1 = (FILE *)this->trace_api_file;
  pcVar5 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar1 == (FILE *)0x0 || bVar7);
  if (pFVar1 != (FILE *)0x0 && !bVar7) {
    fprintf(pFVar1,"%s\n","vars");
    fflush((FILE *)this->trace_api_file);
  }
  pcVar4 = "int CaDiCaL::Solver::vars()";
  pSVar6 = this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"int CaDiCaL::Solver::vars()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar5);
  if (this->external == (External *)0x0) {
    vars();
LAB_0085d630:
    vars();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0085d630;
    if ((this->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
      return this->external->max_var;
    }
  }
  vars();
  bVar7 = pSVar6->internal == (Internal *)0x0;
  pFVar1 = (FILE *)pSVar6->trace_api_file;
  file_name = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)pcVar5 >> 8),pFVar1 == (FILE *)0x0 || bVar7);
  if (pFVar1 != (FILE *)0x0 && !bVar7) {
    file_name = (EVP_PKEY_CTX *)((ulong)pcVar4 & 0xffffffff);
    fprintf(pFVar1,"%s %d\n","reserve");
    fflush((FILE *)pSVar6->trace_api_file);
  }
  pcVar5 = "void CaDiCaL::Solver::reserve(int)";
  this_00 = pSVar6;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar6,"void CaDiCaL::Solver::reserve(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)file_name);
  if (pSVar6->external == (External *)0x0) {
    reserve();
LAB_0085d6cc:
    reserve();
  }
  else {
    if (pSVar6->internal == (Internal *)0x0) goto LAB_0085d6cc;
    if ((pSVar6->_state & VALID) != 0) {
      transition_to_steady_state(pSVar6);
      External::reset_extended(pSVar6->external);
      iVar2 = External::init(pSVar6->external,(EVP_PKEY_CTX *)((ulong)pcVar4 & 0xffffffff));
      return iVar2;
    }
  }
  reserve();
  pSVar6 = this_00;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_00,"void CaDiCaL::Solver::trace_api_calls(FILE *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)file_name);
  if (this_00->external == (External *)0x0) {
    trace_api_calls();
LAB_0085d74d:
    trace_api_calls();
LAB_0085d752:
    trace_api_calls();
LAB_0085d757:
    trace_api_calls();
  }
  else {
    if (this_00->internal == (Internal *)0x0) goto LAB_0085d74d;
    if ((this_00->_state & VALID) == 0) goto LAB_0085d752;
    if ((FILE *)pcVar5 == (FILE *)0x0) goto LAB_0085d757;
    if (tracing_api_calls_through_environment_variable_method != '\x01') {
      if (this_00->trace_api_file == (FILE *)0x0) {
        this_00->trace_api_file = (FILE *)pcVar5;
        fprintf((FILE *)pcVar5,"%s\n","init");
        iVar2 = fflush((FILE *)this_00->trace_api_file);
        return iVar2;
      }
      goto LAB_0085d761;
    }
  }
  trace_api_calls();
LAB_0085d761:
  trace_api_calls();
  pOVar3 = Options::has(&pSVar6->adding_clause);
  return (int)CONCAT71((int7)((ulong)pOVar3 >> 8),pOVar3 != (Option *)0x0);
}

Assistant:

int Solver::vars () {
  TRACE ("vars");
  REQUIRE_VALID_OR_SOLVING_STATE ();
  int res = external->max_var;
  LOG_API_CALL_RETURNS ("vars", res);
  return res;
}